

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O3

float __thiscall webrtc::NoiseSuppressionImpl::speech_probability(NoiseSuppressionImpl *this)

{
  pointer puVar1;
  pointer puVar2;
  unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
  *suppressor;
  pointer puVar3;
  float fVar4;
  float fVar5;
  CritScope cs;
  CritScope local_20;
  
  rtc::CritScope::CritScope(&local_20,this->crit_);
  puVar2 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  fVar5 = 0.0;
  puVar3 = puVar2;
  if (puVar2 != puVar1) {
    do {
      fVar4 = WebRtcNs_prior_speech_probability
                        (((puVar2->_M_t).
                          super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                          .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_false>.
                         _M_head_impl)->state_);
      fVar5 = fVar5 + fVar4;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    puVar2 = (this->suppressors_).
             super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->suppressors_).
             super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar3 != puVar2) {
    fVar5 = fVar5 / (float)(ulong)((long)puVar3 - (long)puVar2 >> 3);
  }
  rtc::CritScope::~CritScope(&local_20);
  return fVar5;
}

Assistant:

float NoiseSuppressionImpl::speech_probability() const {
  rtc::CritScope cs(crit_);
#if defined(WEBRTC_NS_FLOAT)
  float probability_average = 0.0f;
  for (auto& suppressor : suppressors_) {
    probability_average +=
        WebRtcNs_prior_speech_probability(suppressor->state());
  }
  if (!suppressors_.empty()) {
    probability_average /= suppressors_.size();
  }
  return probability_average;
#elif defined(WEBRTC_NS_FIXED)
  // TODO(peah): Returning error code as a float! Remove this.
  // Currently not available for the fixed point implementation.
  return AudioProcessing::kUnsupportedFunctionError;
#endif
}